

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

void resizeFramebuffer(_GLFWwindow *window)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  wl_egl_window *pwVar4;
  uint uVar5;
  uint uVar6;
  
  iVar1 = (window->wl).width;
  if ((window->wl).fractionalScale == (wp_fractional_scale_v1 *)0x0) {
    iVar3 = (window->wl).bufferScale;
    uVar6 = iVar1 * iVar3;
    uVar5 = iVar3 * (window->wl).height;
  }
  else {
    uVar2 = (window->wl).scalingNumerator;
    uVar6 = (iVar1 * uVar2) / 0x78;
    uVar5 = (uVar2 * (window->wl).height) / 0x78;
  }
  (window->wl).fbWidth = uVar6;
  (window->wl).fbHeight = uVar5;
  pwVar4 = (window->wl).egl.window;
  if (pwVar4 != (wl_egl_window *)0x0) {
    (*_glfw.wl.egl.window_resize)(pwVar4,uVar6,uVar5,0,0);
  }
  if ((window->wl).transparent == 0) {
    setContentAreaOpaque(window);
  }
  _glfwInputFramebufferSize(window,(window->wl).fbWidth,(window->wl).fbHeight);
  return;
}

Assistant:

static void resizeFramebuffer(_GLFWwindow* window)
{
    if (window->wl.fractionalScale)
    {
        window->wl.fbWidth = (window->wl.width * window->wl.scalingNumerator) / 120;
        window->wl.fbHeight = (window->wl.height * window->wl.scalingNumerator) / 120;
    }
    else
    {
        window->wl.fbWidth = window->wl.width * window->wl.bufferScale;
        window->wl.fbHeight = window->wl.height * window->wl.bufferScale;
    }

    if (window->wl.egl.window)
    {
        wl_egl_window_resize(window->wl.egl.window,
                             window->wl.fbWidth,
                             window->wl.fbHeight,
                             0, 0);
    }

    if (!window->wl.transparent)
        setContentAreaOpaque(window);

    _glfwInputFramebufferSize(window, window->wl.fbWidth, window->wl.fbHeight);
}